

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAnalytic_mels.c
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  N_Vector y;
  long *plVar5;
  char *pcVar6;
  double dVar7;
  sunrealtype rtol;
  sunrealtype in_XMM2_Qa;
  void *cvode_mem;
  sunrealtype t;
  sunrealtype lambda;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfe;
  long nst;
  long local_88;
  double local_80;
  undefined8 local_78;
  double local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  local_78 = 0xc059000000000000;
  local_88 = 0;
  puts("\nAnalytical ODE test problem:");
  printf("   lambda = %g\n",local_78);
  printf("   reltol = %.1e\n",0x3eb0c6f7a0b5ed8d);
  printf("   abstol = %.1e\n\n",0x3ddb7cdfd9d7bdbb);
  uVar3 = SUNContext_Create(0,&sunctx);
  if ((int)uVar3 < 0) {
    pcVar6 = "SUNContext_Create";
  }
  else {
    y = (N_Vector)N_VNew_Serial(1,sunctx);
    if (y == (N_Vector)0x0) {
      main_cold_3();
      return 1;
    }
    N_VConst(0,y);
    local_88 = CVodeCreate(2,sunctx);
    if (local_88 == 0) {
      main_cold_2();
      return 1;
    }
    uVar3 = CVodeInit(0,local_88,f,y);
    if ((int)uVar3 < 0) {
      pcVar6 = "CVodeInit";
    }
    else {
      uVar3 = CVodeSetUserData(local_88,&local_78);
      if ((int)uVar3 < 0) {
        pcVar6 = "CVodeSetUserData";
      }
      else {
        rtol = 1e-10;
        uVar3 = CVodeSStolerances(0x3eb0c6f7a0b5ed8d,local_88);
        lVar2 = local_88;
        if ((int)uVar3 < 0) {
          pcVar6 = "CVodeSStolerances";
        }
        else {
          plVar5 = (long *)SUNLinSolNewEmpty(sunctx);
          if (plVar5 == (long *)0x0) {
            plVar5 = (long *)0x0;
          }
          else {
            puVar1 = (undefined8 *)plVar5[1];
            *puVar1 = MatrixEmbeddedLSType;
            puVar1[8] = MatrixEmbeddedLSSolve;
            puVar1[0xe] = MatrixEmbeddedLSFree;
            *plVar5 = lVar2;
          }
          if (plVar5 == (long *)0x0) {
            main_cold_1();
            return 1;
          }
          uVar3 = CVodeSetLinearSolver(local_88,plVar5,0);
          if (-1 < (int)uVar3) {
            local_80 = 0.0;
            puts("        t           u");
            puts("   ---------------------");
            if (1e-15 < 10.0 - local_80) {
              dVar7 = 1.0;
              do {
                local_70 = dVar7;
                uVar3 = CVode(local_88,y,&local_80,1);
                if ((int)uVar3 < 0) {
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","CVode",
                          (ulong)uVar3);
                  break;
                }
                printf("  %10.6f  %10.6f\n",local_80,**(undefined8 **)((long)y->content + 0x10));
                in_XMM2_Qa = local_70 + 1.0;
                rtol = 10.0 - local_80;
                dVar7 = 10.0;
                if (in_XMM2_Qa <= 10.0) {
                  dVar7 = in_XMM2_Qa;
                }
              } while (1e-15 < rtol);
            }
            puts("   ---------------------");
            uVar3 = CVodeGetNumSteps(local_88,&local_30);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","CVodeGetNumSteps",
                      (ulong)uVar3);
            }
            uVar3 = CVodeGetNumRhsEvals(local_88,&local_38);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "CVodeGetNumRhsEvals",(ulong)uVar3);
            }
            uVar3 = CVodeGetNumLinSolvSetups(local_88,&local_40);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "CVodeGetNumLinSolvSetups",(ulong)uVar3);
            }
            uVar3 = CVodeGetNumErrTestFails(local_88,&local_68);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "CVodeGetNumErrTestFails",(ulong)uVar3);
            }
            uVar3 = CVodeGetNumNonlinSolvIters(local_88,&local_58);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "CVodeGetNumNonlinSolvIters",(ulong)uVar3);
            }
            uVar3 = CVodeGetNumNonlinSolvConvFails(local_88,&local_60);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "CVodeGetNumNonlinSolvConvFails",(ulong)uVar3);
            }
            uVar3 = CVodeGetNumJacEvals(local_88,&local_48);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "CVodeGetNumJacEvals",(ulong)uVar3);
            }
            uVar3 = CVodeGetNumLinRhsEvals(local_88,&local_50);
            if ((int)uVar3 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "CVodeGetNumLinRhsEvals",(ulong)uVar3);
            }
            puts("\nFinal Solver Statistics:");
            printf("   Internal solver steps = %li\n",local_30);
            printf("   Total RHS evals = %li\n",local_38);
            printf("   Total linear solver setups = %li\n",local_40);
            printf("   Total RHS evals for setting up the linear system = %li\n",local_50);
            printf("   Total number of Jacobian evaluations = %li\n",local_48);
            printf("   Total number of Newton iterations = %li\n",local_58);
            printf("   Total number of linear solver convergence failures = %li\n",local_60);
            printf("   Total number of error test failures = %li\n\n",local_68);
            iVar4 = check_ans(y,local_80,rtol,in_XMM2_Qa);
            N_VDestroy(y);
            CVodeFree(&local_88);
            SUNLinSolFree(plVar5);
            SUNContext_Free(&sunctx);
            return iVar4;
          }
          pcVar6 = "CVodeSetLinearSolver";
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar6,(ulong)uVar3);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);   /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);    /* time between outputs */
  sunindextype NEQ   = 1;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunrealtype lambda = SUN_RCONST(-100.0); /* stiffness parameter */

  /* general problem variables */
  int retval;                /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* cvode_mem    = NULL; /* empty CVode memory structure */
  sunrealtype t, tout;
  long int nst, nfe, nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Initial diagnostics output */
  printf("\nAnalytical ODE test problem:\n");
  printf("   lambda = %" GSYM "\n", lambda);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, sunctx); /* Create serial vector for solution */
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(0.0), y); /* Specify initial condition */

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSetUserData to specify the stiffness factor */
  retval = CVodeSetUserData(cvode_mem, (void*)&lambda);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Call CVodeSStolerances to specify the scalar relative and absolute tolerances */
  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create custom matrix-embedded linear solver */
  LS = MatrixEmbeddedLS(cvode_mem);
  if (check_retval((void*)LS, "MatrixEmbeddedLS", 0)) { return 1; }

  /* Call CVodeSetLinearSolver to attach the linear solver to CVode */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* In loop, call CVode, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached.  */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL); /* call integrator */
    if (check_retval(&retval, "CVode", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    if (retval >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");

  /* Get/print some final statistics on how the solve progressed */
  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);
  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  check_retval(&retval, "CVodeGetNumJacEvals", 1);
  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li\n", nst);
  printf("   Total RHS evals = %li\n", nfe);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of linear solver convergence failures = %li\n", ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* check the solution error */
  retval = check_ans(y, t, reltol, abstol);

  /* Clean up and return */
  N_VDestroy(y);         /* Free y vector */
  CVodeFree(&cvode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);     /* Free linear solver */
  SUNContext_Free(&sunctx);

  return retval;
}